

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O2

void __thiscall nv::ColorBlock::sortColorsByAbsoluteValue(ColorBlock *this)

{
  anon_union_4_2_12391d8d_for_Color32_0 aVar1;
  ulong uVar2;
  ulong uVar3;
  Color32 temp;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  anon_union_4_2_12391d8d_for_Color32_0 aVar7;
  ushort uVar8;
  
  uVar2 = 1;
  uVar3 = 0;
  while (uVar3 != 0x10) {
    aVar1 = (anon_union_4_2_12391d8d_for_Color32_0)this->m_color[uVar3].field_0.u;
    uVar5 = uVar3 & 0xffffffff;
    aVar7 = aVar1;
    for (uVar4 = uVar2; uVar4 != 0x10; uVar4 = uVar4 + 1) {
      uVar6 = (ushort)aVar7.u;
      uVar8 = (ushort)this->m_color[uVar4].field_0.u;
      if (uVar6 <= uVar8) {
        aVar7.u = this->m_color[uVar4].field_0.u;
      }
      if (uVar6 < uVar8) {
        uVar5 = uVar4 & 0xffffffff;
      }
    }
    this->m_color[uVar3].field_0 = this->m_color[uVar5].field_0;
    this->m_color[uVar5].field_0.u = (uint32)aVar1;
    uVar2 = uVar2 + 1;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ColorBlock::sortColorsByAbsoluteValue()
{
	// Dummy selection sort.
	for( uint a = 0; a < 16; a++ ) {
		uint max = a;
		Color16 cmax(m_color[a]);
		
		for( uint b = a+1; b < 16; b++ ) {
			Color16 cb(m_color[b]);
			
			if( cb.u > cmax.u ) {
				max = b;
				cmax = cb;
			}
		}
		swap( m_color[a], m_color[max] );
	}
}